

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  ZSTD_seqSymbol ZVar5;
  undefined8 uVar6;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  seq_t sequence_02;
  seq_t sequence_03;
  seq_t sequence_04;
  U16 *pUVar7;
  U32 i;
  ZSTD_litLocation_e ZVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  size_t sVar17;
  ZSTD_seqSymbol *pZVar18;
  ZSTD_seqSymbol *oend_00;
  ZSTD_seqSymbol *pZVar19;
  BYTE *pBVar20;
  ZSTD_seqSymbol ZVar21;
  ZSTD_seqSymbol *pZVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  BYTE *oend;
  ZSTD_seqSymbol *pZVar27;
  ZSTD_seqSymbol ZVar28;
  ZSTD_seqSymbol ZVar29;
  ZSTD_seqSymbol *pZVar30;
  seq_t sequences [8];
  ZSTD_seqSymbol local_210;
  ZSTD_seqSymbol local_208;
  ZSTD_seqSymbol *local_200;
  ZSTD_seqSymbol *local_1f8;
  BYTE *local_1f0;
  ZSTD_seqSymbol local_1e8;
  ZSTD_seqSymbol local_1e0;
  BYTE *local_1d8;
  ZSTD_seqSymbol local_1d0;
  ZSTD_seqSymbol *local_1c8;
  uint local_1bc;
  ZSTD_seqSymbol local_1b8;
  BIT_DStream_t local_1b0;
  ZSTD_fseState local_188;
  ZSTD_fseState local_178;
  ZSTD_fseState local_168;
  ZSTD_seqSymbol local_158 [3];
  ZSTD_seqSymbol local_140;
  BYTE *local_138;
  ZSTD_seqSymbol local_130;
  ZSTD_seqSymbol local_128;
  ZSTD_seqSymbol local_120;
  ZSTD_seqSymbol *local_118;
  ZSTD_seqSymbol *local_110;
  ZSTD_seqSymbol *local_108;
  ulong local_100;
  ZSTD_seqSymbol local_f8 [2];
  ZSTD_seqSymbol local_e8 [23];
  
  if (dctx->bmi2 != 0) {
    sVar11 = ZSTD_decompressSequencesLong_bmi2
                       (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset,frame);
    return sVar11;
  }
  ZVar8 = dctx->litBufferLocation;
  if (ZVar8 == ZSTD_in_dst) {
    oend_00 = (ZSTD_seqSymbol *)dctx->litBuffer;
  }
  else {
    oend_00 = (ZSTD_seqSymbol *)(maxDstSize + (long)dst);
  }
  local_208 = (ZSTD_seqSymbol)dctx->litPtr;
  ZVar21 = (ZSTD_seqSymbol)dctx->litBufferEnd;
  local_140 = (ZSTD_seqSymbol)dst;
  if (nbSeq == 0) goto LAB_001801bf;
  local_200 = (ZSTD_seqSymbol *)dctx->prefixStart;
  local_1d8 = (BYTE *)dctx->virtualStart;
  local_1f0 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar12 = -0xc;
  do {
    *(ulong *)(&local_158[3].nextState + lVar12) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar12);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0);
  local_1bc = 8;
  if (nbSeq < 8) {
    local_1bc = nbSeq;
  }
  if (dst == (void *)0x0) {
    __assert_fail("dst != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xab40,
                  "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                 );
  }
  if ((long)seqSize < 0) {
    __assert_fail("iend >= ip",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xab41,
                  "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                 );
  }
  if (seqSize == 0) {
    return 0xffffffffffffffec;
  }
  local_1b0.limitPtr = (char *)((long)seqStart + 8);
  if (seqSize < 8) {
    local_1b0.bitContainer._1_7_ = 0;
    local_1b0.bitContainer._0_1_ = *seqStart;
    switch(seqSize) {
    case 7:
      local_1b0.bitContainer = local_1b0.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30
      ;
    case 6:
      local_1b0.bitContainer =
           local_1b0.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
    case 5:
      local_1b0.bitContainer =
           local_1b0.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
    case 4:
      local_1b0.bitContainer =
           local_1b0.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
    case 3:
      local_1b0.bitContainer =
           local_1b0.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
    case 2:
      local_1b0.bitContainer = (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_1b0.bitContainer
      ;
    }
    bVar3 = *(byte *)((long)seqStart + (seqSize - 1));
    if (bVar3 == 0) {
      return 0xffffffffffffffec;
    }
    uVar9 = 0x1f;
    if (bVar3 != 0) {
      for (; bVar3 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    local_1b0.bitsConsumed = (uVar9 ^ 0x1f) + (int)seqSize * -8 + 0x29;
    local_1b0.ptr = (char *)seqStart;
  }
  else {
    local_1b0.ptr = (char *)((long)seqStart + (seqSize - 8));
    local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
    if (local_1b0.bitContainer >> 0x38 == 0) {
      return 0xffffffffffffffec;
    }
    uVar9 = 0x1f;
    if (SUB81(local_1b0.bitContainer,7) != 0) {
      for (; (byte)(SUB81(local_1b0.bitContainer,7) >> uVar9) == 0; uVar9 = uVar9 - 1) {
      }
    }
    local_1b0.bitsConsumed = ~uVar9 + 9;
  }
  local_1d0 = ZVar21;
  local_1b0.start = (char *)seqStart;
  ZSTD_initFseState(&local_188,&local_1b0,dctx->LLTptr);
  ZSTD_initFseState(&local_178,&local_1b0,dctx->OFTptr);
  ZSTD_initFseState(&local_168,&local_1b0,dctx->MLTptr);
  uVar13 = (ulong)local_1b0.bitsConsumed;
  uVar26 = 0;
  if (local_1b0.bitsConsumed < 0x41) {
    local_110 = (ZSTD_seqSymbol *)local_1b0.limitPtr;
    local_118 = (ZSTD_seqSymbol *)local_1b0.start;
    local_1c8 = local_168.table;
    local_108 = local_178.table;
    local_120 = local_158[1];
    uVar25 = 0;
    uVar26 = 0;
    if (0 < (int)local_1bc) {
      uVar26 = (ulong)local_1bc;
    }
    ZVar21 = (ZSTD_seqSymbol)local_e8;
    ZVar29 = (ZSTD_seqSymbol)local_1b0.bitContainer;
    pZVar27 = (ZSTD_seqSymbol *)local_1b0.ptr;
    do {
      if (pZVar27 < local_1b0.limitPtr) {
        if (pZVar27 != (ZSTD_seqSymbol *)local_1b0.start) {
          uVar23 = (ulong)(uint)((int)pZVar27 - (int)local_1b0.start);
          if (local_1b0.start <= (ZSTD_seqSymbol *)((long)pZVar27 - (uVar13 >> 3))) {
            uVar23 = uVar13 >> 3;
          }
          local_1b0.bitsConsumed = (uint)uVar13 + (int)uVar23 * -8;
          goto LAB_00180422;
        }
      }
      else {
        uVar23 = uVar13 >> 3;
        local_1b0.bitsConsumed = (uint)uVar13 & 7;
LAB_00180422:
        pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - uVar23);
        uVar13 = (ulong)local_1b0.bitsConsumed;
        ZVar29 = *pZVar27;
        local_1b0.bitContainer = (size_t)ZVar29;
        local_1b0.ptr = (char *)pZVar27;
      }
      local_158[1] = local_120;
      if (uVar26 == uVar25) goto LAB_00180819;
      local_128 = ZVar21;
      bVar3 = local_188.table[local_188.state].nbAdditionalBits;
      local_1e8 = ZVar29;
      if (0x10 < bVar3) goto LAB_00182287;
      bVar16 = local_168.table[local_168.state].nbAdditionalBits;
      if (0x10 < bVar16) goto LAB_001822a6;
      bVar4 = local_178.table[local_178.state].nbAdditionalBits;
      local_1f8 = pZVar27;
      if (0x1f < bVar4) goto LAB_00182268;
      local_1e0.baseValue = 0;
      local_1e0._0_4_ = local_168.table[local_168.state].baseValue;
      uVar9 = local_188.table[local_188.state].baseValue;
      ZVar28.baseValue = 0;
      ZVar28.nextState = (short)uVar9;
      ZVar28.nbAdditionalBits = (char)(uVar9 >> 0x10);
      ZVar28.nbBits = (char)(uVar9 >> 0x18);
      local_100 = (ulong)local_188.table[local_188.state].nextState;
      local_130.nbAdditionalBits = '\0';
      local_130.nbBits = '\0';
      local_130.baseValue = 0;
      local_130.nextState = local_168.table[local_168.state].nextState;
      local_1b8.nbAdditionalBits = '\0';
      local_1b8.nbBits = '\0';
      local_1b8.baseValue = 0;
      local_1b8.nextState = local_178.table[local_178.state].nextState;
      bVar15 = local_168.table[local_168.state].nbBits;
      local_138 = (BYTE *)CONCAT44(local_138._4_4_,(uint)bVar15);
      bVar14 = (byte)uVar13;
      local_158[1] = local_158[0];
      if (bVar4 < 2) {
        if (bVar4 == 0) {
          local_158[0] = local_158[uVar9 == 0];
          local_158[1] = local_158[uVar9 != 0];
        }
        else {
          uVar13 = (ulong)((int)uVar13 + 1);
          lVar12 = (ulong)(local_178.table[local_178.state].baseValue + (uint)(uVar9 == 0)) -
                   (((long)ZVar29 << (bVar14 & 0x3f)) >> 0x3f);
          if (lVar12 == 3) {
            local_158[0] = (ZSTD_seqSymbol)
                           ((long)((long)local_158[0] + -1) +
                           (ulong)(local_158[0] == (ZSTD_seqSymbol)0x1));
          }
          else {
            local_158[0] = (ZSTD_seqSymbol)
                           ((long)local_158[lVar12] +
                           (ulong)(local_158[lVar12] == (ZSTD_seqSymbol)0x0));
            if (lVar12 == 1) goto LAB_00180570;
          }
          local_158[2] = local_120;
        }
      }
      else {
        local_158[2] = local_120;
        uVar13 = (ulong)((int)uVar13 + (uint)bVar4);
        local_158[0] = (ZSTD_seqSymbol)
                       (((ulong)((long)ZVar29 << (bVar14 & 0x3f)) >> (-bVar4 & 0x3f)) +
                       (ulong)local_178.table[local_178.state].baseValue);
      }
LAB_00180570:
      if (bVar16 != 0) {
        bVar14 = (byte)uVar13;
        uVar13 = (ulong)((int)uVar13 + (uint)bVar16);
        local_1e0 = (ZSTD_seqSymbol)
                    ((long)local_1e0 +
                    ((ulong)((long)ZVar29 << (bVar14 & 0x3f)) >> (-bVar16 & 0x3f)));
      }
      uVar9 = (uint)uVar13;
      if ((0x1e < (byte)(bVar16 + bVar3 + bVar4)) && (uVar9 < 0x41)) {
        if (pZVar27 < local_1b0.limitPtr) {
          if (pZVar27 != (ZSTD_seqSymbol *)local_1b0.start) {
            uVar23 = (ulong)(uint)((int)pZVar27 - (int)local_1b0.start);
            if (local_1b0.start <= (ZSTD_seqSymbol *)((long)pZVar27 - (uVar13 >> 3))) {
              uVar23 = uVar13 >> 3;
            }
            local_1f8 = (ZSTD_seqSymbol *)((long)pZVar27 - uVar23);
            uVar9 = uVar9 + (int)uVar23 * -8;
            ZVar29 = *local_1f8;
            local_1b0.bitContainer = (size_t)ZVar29;
            local_1b0.ptr = (char *)local_1f8;
          }
        }
        else {
          local_1f8 = (ZSTD_seqSymbol *)((long)pZVar27 - (uVar13 >> 3));
          uVar9 = uVar9 & 7;
          ZVar29 = *local_1f8;
          local_1b0.bitContainer = (size_t)ZVar29;
          local_1b0.ptr = (char *)local_1f8;
        }
      }
      local_120 = local_158[1];
      if (bVar3 != 0) {
        bVar16 = (byte)uVar9;
        uVar9 = uVar9 + bVar3;
        ZVar28 = (ZSTD_seqSymbol)
                 ((long)ZVar28 + ((ulong)((long)ZVar29 << (bVar16 & 0x3f)) >> (-bVar3 & 0x3f)));
      }
      iVar10 = uVar9 + local_188.table[local_188.state].nbBits;
      local_188.state =
           (~(-1L << (local_188.table[local_188.state].nbBits & 0x3f)) &
           (ulong)ZVar29 >> (-(char)iVar10 & 0x3fU)) +
           (ulong)local_188.table[local_188.state].nextState;
      iVar10 = iVar10 + (uint)bVar15;
      local_168.state =
           (~(-1L << (bVar15 & 0x3f)) & (ulong)ZVar29 >> (-(char)iVar10 & 0x3fU)) + (long)local_130;
      local_1b0.bitsConsumed = iVar10 + (uint)local_178.table[local_178.state].nbBits;
      uVar13 = (ulong)local_1b0.bitsConsumed;
      local_178.state =
           (~(-1L << (local_178.table[local_178.state].nbBits & 0x3f)) &
           (ulong)ZVar29 >> (-(char)local_1b0.bitsConsumed & 0x3fU)) + (long)local_1b8;
      *(ZSTD_seqSymbol *)((long)ZVar21 + -0x10) = ZVar28;
      *(ZSTD_seqSymbol *)((long)ZVar21 + -8) = local_1e0;
      *(ZSTD_seqSymbol *)ZVar21 = local_158[0];
      uVar25 = uVar25 + 1;
      ZVar21 = (ZSTD_seqSymbol)((long)ZVar21 + 0x18);
      pZVar27 = local_1f8;
    } while (local_1b0.bitsConsumed < 0x41);
    uVar26 = uVar25 & 0xffffffff;
  }
  if ((int)uVar26 < (int)local_1bc) {
    return 0xffffffffffffffec;
  }
LAB_00180819:
  local_1c8 = oend_00 + -4;
  local_1b8 = (ZSTD_seqSymbol)dctx->litExtraBuffer;
  local_130 = (ZSTD_seqSymbol)((long)dctx->litExtraBuffer + 0x10000);
  local_138 = dctx->litExtraBuffer + 0x10;
  dst = (void *)local_140;
LAB_0018085a:
  ZVar21 = local_158[1];
  uVar9 = (uint)uVar13;
  uVar24 = (uint)uVar26;
  local_1e0 = (ZSTD_seqSymbol)dst;
  if (0x40 < uVar9) goto LAB_00181723;
  if (local_1b0.ptr < local_1b0.limitPtr) {
    if (local_1b0.ptr != local_1b0.start) {
      uVar26 = (ulong)(uint)((int)local_1b0.ptr - (int)local_1b0.start);
      if (local_1b0.start <= (ZSTD_seqSymbol *)((long)local_1b0.ptr - (uVar13 >> 3))) {
        uVar26 = uVar13 >> 3;
      }
      local_1b0.bitsConsumed = uVar9 + (int)uVar26 * -8;
      goto LAB_001808cd;
    }
  }
  else {
    uVar26 = uVar13 >> 3;
    local_1b0.bitsConsumed = uVar9 & 7;
LAB_001808cd:
    local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar26);
    uVar13 = (ulong)local_1b0.bitsConsumed;
    local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
  }
  if (nbSeq <= (int)uVar24) goto LAB_00181734;
  bVar3 = local_188.table[local_188.state].nbAdditionalBits;
  if (0x10 < bVar3) {
LAB_00182287:
    __assert_fail("llBits <= MaxLLBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa948,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar16 = local_168.table[local_168.state].nbAdditionalBits;
  if (0x10 < bVar16) {
LAB_001822a6:
    __assert_fail("mlBits <= MaxMLBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa949,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar4 = local_178.table[local_178.state].nbAdditionalBits;
  if (0x1f < bVar4) {
LAB_00182268:
    __assert_fail("ofBits <= MaxOff",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa94a,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  local_210.baseValue = 0;
  local_210._0_4_ = local_168.table[local_168.state].baseValue;
  uVar9 = local_188.table[local_188.state].baseValue;
  local_1e8.baseValue = 0;
  local_1e8.nextState = (short)uVar9;
  local_1e8.nbAdditionalBits = (char)(uVar9 >> 0x10);
  local_1e8.nbBits = (char)(uVar9 >> 0x18);
  local_1f8 = (ZSTD_seqSymbol *)(ulong)local_168.table[local_168.state].nextState;
  bVar15 = (byte)uVar13;
  if (bVar4 < 2) {
    if (bVar4 == 0) {
      local_128 = local_158[uVar9 == 0];
      local_158[0] = local_158[uVar9 != 0];
    }
    else {
      uVar13 = (ulong)((int)uVar13 + 1);
      lVar12 = (ulong)(local_178.table[local_178.state].baseValue + (uint)(uVar9 == 0)) -
               ((long)(local_1b0.bitContainer << (bVar15 & 0x3f)) >> 0x3f);
      if (lVar12 == 3) {
        local_128 = (ZSTD_seqSymbol)
                    ((long)((long)local_158[0] + -1) + (ulong)(local_158[0] == (ZSTD_seqSymbol)0x1))
        ;
      }
      else {
        local_128 = (ZSTD_seqSymbol)
                    ((long)local_158[lVar12] + (ulong)(local_158[lVar12] == (ZSTD_seqSymbol)0x0));
        if (lVar12 == 1) goto LAB_001809e9;
      }
      local_158[2] = local_158[1];
    }
LAB_001809e9:
    local_158[1] = local_158[0];
  }
  else {
    uVar13 = (ulong)((int)uVar13 + (uint)bVar4);
    local_128 = (ZSTD_seqSymbol)
                (((local_1b0.bitContainer << (bVar15 & 0x3f)) >> (-bVar4 & 0x3f)) +
                (ulong)local_178.table[local_178.state].baseValue);
    local_158[1] = local_158[0];
    local_158[2] = ZVar21;
  }
  local_158[0] = local_128;
  if (bVar16 != 0) {
    bVar15 = (byte)uVar13;
    uVar13 = (ulong)((int)uVar13 + (uint)bVar16);
    local_210 = (ZSTD_seqSymbol)
                ((long)local_210 + ((local_1b0.bitContainer << (bVar15 & 0x3f)) >> (-bVar16 & 0x3f))
                );
  }
  uVar9 = (uint)uVar13;
  if ((0x1e < (byte)(bVar16 + bVar3 + bVar4)) && (uVar9 < 0x41)) {
    if (local_1b0.ptr < local_1b0.limitPtr) {
      if (local_1b0.ptr != local_1b0.start) {
        uVar26 = (ulong)(uint)((int)local_1b0.ptr - (int)local_1b0.start);
        if (local_1b0.start <= (ZSTD_seqSymbol *)((long)local_1b0.ptr - (uVar13 >> 3))) {
          uVar26 = uVar13 >> 3;
        }
        local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar26);
        uVar9 = uVar9 + (int)uVar26 * -8;
        local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
      }
    }
    else {
      local_1b0.ptr = (char *)((long)local_1b0.ptr - (uVar13 >> 3));
      uVar9 = uVar9 & 7;
      local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
    }
  }
  if (bVar3 != 0) {
    bVar16 = (byte)uVar9;
    uVar9 = uVar9 + bVar3;
    local_1e8 = (ZSTD_seqSymbol)
                ((long)local_1e8 + ((local_1b0.bitContainer << (bVar16 & 0x3f)) >> (-bVar3 & 0x3f)))
    ;
  }
  iVar10 = uVar9 + local_188.table[local_188.state].nbBits;
  local_188.state =
       (~(-1L << (local_188.table[local_188.state].nbBits & 0x3f)) &
       local_1b0.bitContainer >> (-(char)iVar10 & 0x3fU)) +
       (ulong)local_188.table[local_188.state].nextState;
  iVar10 = iVar10 + (uint)local_168.table[local_168.state].nbBits;
  local_168.state =
       (long)&local_1f8->nextState +
       (~(-1L << (local_168.table[local_168.state].nbBits & 0x3f)) &
       local_1b0.bitContainer >> (-(char)iVar10 & 0x3fU));
  local_1b0.bitsConsumed = iVar10 + (uint)local_178.table[local_178.state].nbBits;
  local_178.state =
       (~(-1L << (local_178.table[local_178.state].nbBits & 0x3f)) &
       local_1b0.bitContainer >> (-(char)local_1b0.bitsConsumed & 0x3fU)) +
       (ulong)local_178.table[local_178.state].nextState;
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar13 = (ulong)(uVar24 & 7);
    pZVar27 = local_f8 + uVar13 * 3;
    ZVar29 = *pZVar27;
    ZVar21 = (ZSTD_seqSymbol)((long)local_208 + (long)ZVar29);
    if (dctx->litBufferEnd < (ulong)ZVar21) {
      uVar26 = (long)dctx->litBufferEnd - (long)local_208;
      if (uVar26 != 0) {
        if ((ulong)((long)oend_00 - (long)dst) < uVar26) {
          return 0xffffffffffffffba;
        }
        ZSTD_safecopyDstBeforeSrc((BYTE *)dst,(BYTE *)local_208,uVar26);
        ZVar29 = (ZSTD_seqSymbol)((long)ZVar29 - uVar26);
        *pZVar27 = ZVar29;
        dst = (void *)((long)local_1e0 + uVar26);
      }
      local_208 = local_1b8;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) goto LAB_001822e4;
      local_1f8 = pZVar27;
      local_1e0 = (ZSTD_seqSymbol)dst;
      if ((long)ZVar29 < 0x10001) {
        ZVar21 = local_f8[uVar13 * 3 + 1];
        uVar26 = (long)ZVar29 + (long)ZVar21;
        pZVar22 = (ZSTD_seqSymbol *)((long)dst + uVar26);
        if (local_1c8 < pZVar22) goto LAB_001812fa;
        if ((long)ZVar29 < 0) goto LAB_00182322;
        if ((long)uVar26 <= (long)ZVar29) goto LAB_00182341;
        if (oend_00 < pZVar22) goto LAB_00182303;
        pZVar27 = (ZSTD_seqSymbol *)((long)dst + (long)ZVar29);
        if (local_1c8 < pZVar27) goto LAB_00182360;
        ZVar28 = local_e8[uVar13 * 3];
        uVar6 = *(undefined8 *)((long)local_1b8 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_1b8;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < (ulong)ZVar29) {
          if (0xffffffffffffffe0 < (ulong)((long)dst + 0x10 + (-0x10 - (long)local_138)))
          goto LAB_001822c5;
          uVar6 = *(undefined8 *)(local_138 + 8);
          *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_138;
          *(undefined8 *)((long)dst + 0x18) = uVar6;
          if (0x10 < (long)ZVar29 - 0x10U) {
            lVar12 = 0;
            do {
              uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20 + 8);
              puVar2 = (undefined8 *)((long)dst + 0x20 + lVar12);
              *puVar2 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20);
              puVar2[1] = uVar6;
              uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30 + 8);
              puVar2[2] = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30);
              puVar2[3] = uVar6;
              lVar12 = lVar12 + 0x20;
            } while ((ZSTD_seqSymbol *)(puVar2 + 4) < pZVar27);
          }
        }
        local_208 = (ZSTD_seqSymbol)((long)ZVar29 + (long)local_1b8);
        pZVar30 = (ZSTD_seqSymbol *)((long)pZVar27 - (long)ZVar28);
        if ((ulong)((long)pZVar27 - (long)local_200) < (ulong)ZVar28) {
          if ((ulong)((long)pZVar27 - (long)local_1d8) < (ulong)ZVar28) {
            return 0xffffffffffffffec;
          }
          lVar12 = ((long)pZVar27 - (long)ZVar28) - (long)local_200;
          pBVar20 = local_1f0 + lVar12;
          if (local_1f0 < pBVar20 + (long)ZVar21) {
            memmove(pZVar27,pBVar20,-lVar12);
            pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
            ZVar21 = (ZSTD_seqSymbol)((long)ZVar21 + lVar12);
            pZVar30 = local_200;
            goto LAB_00180c7c;
          }
          memmove(pZVar27,pBVar20,(size_t)ZVar21);
        }
        else {
LAB_00180c7c:
          if (pZVar22 < pZVar27) goto LAB_0018239e;
          if (pZVar30 < local_200) goto LAB_0018237f;
          if (ZVar21 == (ZSTD_seqSymbol)0x0) goto LAB_001823bd;
          if ((ulong)ZVar28 < 0x10) {
            if (pZVar27 < pZVar30) goto LAB_00182550;
            if ((ulong)ZVar28 < 8) {
              iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)ZVar28 * 4);
              *(BYTE *)&pZVar27->nextState = (BYTE)pZVar30->nextState;
              *(BYTE *)((long)&pZVar27->nextState + 1) = *(BYTE *)((long)&pZVar30->nextState + 1);
              pZVar27->nbAdditionalBits = pZVar30->nbAdditionalBits;
              pZVar27->nbBits = pZVar30->nbBits;
              pUVar7 = &pZVar30->nextState;
              pZVar30 = (ZSTD_seqSymbol *)
                        ((long)pZVar30 +
                        ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar28 * 4) -
                        (long)iVar10));
              pZVar27->baseValue =
                   *(U32 *)((long)pUVar7 +
                           (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar28 * 4));
            }
            else {
              *pZVar27 = *pZVar30;
            }
            pZVar19 = pZVar30 + 1;
            pZVar18 = pZVar27 + 1;
            if ((long)pZVar18 - (long)pZVar19 < 8) goto LAB_00182531;
            if (8 < (ulong)ZVar21) {
              if (pZVar22 <= pZVar18) goto LAB_0018256f;
              pZVar22 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + (long)ZVar21);
              if ((ulong)((long)pZVar18 - (long)pZVar19) < 0x10) {
                do {
                  *pZVar18 = *pZVar19;
                  pZVar18 = pZVar18 + 1;
                  pZVar19 = pZVar19 + 1;
                } while (pZVar18 < pZVar22);
              }
              else {
                ZVar29 = pZVar30[2];
                *pZVar18 = *pZVar19;
                pZVar27[2] = ZVar29;
                if (0x18 < (long)ZVar21) {
                  lVar12 = 0;
                  do {
                    pBVar1 = (BYTE *)((long)&pZVar30[3].nextState + lVar12);
                    uVar6 = *(undefined8 *)(pBVar1 + 8);
                    pBVar20 = (BYTE *)((long)&pZVar27[3].nextState + lVar12);
                    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar1;
                    *(undefined8 *)(pBVar20 + 8) = uVar6;
                    pBVar1 = (BYTE *)((long)&pZVar30[5].nextState + lVar12);
                    uVar6 = *(undefined8 *)(pBVar1 + 8);
                    *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pBVar1;
                    *(undefined8 *)(pBVar20 + 0x18) = uVar6;
                    lVar12 = lVar12 + 0x20;
                  } while ((ZSTD_seqSymbol *)(pBVar20 + 0x20) < pZVar22);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)pZVar27 + (-0x10 - (long)pZVar30)))
            goto LAB_001822c5;
            ZVar29 = pZVar30[1];
            *pZVar27 = *pZVar30;
            pZVar27[1] = ZVar29;
            if (0x10 < (long)ZVar21) {
              lVar12 = 0x10;
              do {
                pBVar20 = (BYTE *)((long)&pZVar30->nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar20 + 8);
                pBVar1 = (BYTE *)((long)&pZVar27->nextState + lVar12);
                *(undefined8 *)pBVar1 = *(undefined8 *)pBVar20;
                *(undefined8 *)(pBVar1 + 8) = uVar6;
                pBVar20 = (BYTE *)((long)&pZVar30[2].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar20 + 8);
                *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)pBVar20;
                *(undefined8 *)(pBVar1 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while (pBVar1 + 0x20 < (BYTE *)((long)&pZVar27->nextState + (long)ZVar21));
            }
          }
        }
      }
      else {
LAB_001812fa:
        pZVar22 = local_e8 + uVar13 * 3;
        pZVar30 = local_f8 + uVar13 * 3 + 1;
        sequence_01.matchLength._0_2_ = pZVar30->nextState;
        sequence_01.matchLength._2_1_ = pZVar30->nbAdditionalBits;
        sequence_01.matchLength._3_1_ = pZVar30->nbBits;
        sequence_01.matchLength._4_4_ = pZVar30->baseValue;
        sequence_01.litLength._0_2_ = pZVar27->nextState;
        sequence_01.litLength._2_1_ = pZVar27->nbAdditionalBits;
        sequence_01.litLength._3_1_ = pZVar27->nbBits;
        sequence_01.litLength._4_4_ = pZVar27->baseValue;
        sequence_01.offset._0_2_ = pZVar22->nextState;
        sequence_01.offset._2_1_ = pZVar22->nbAdditionalBits;
        sequence_01.offset._3_1_ = pZVar22->nbBits;
        sequence_01.offset._4_4_ = pZVar22->baseValue;
        uVar26 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,(BYTE *)oend_00,sequence_01,(BYTE **)&local_208,
                            (BYTE *)local_130,(BYTE *)local_200,local_1d8,local_1f0);
      }
      if (0xffffffffffffff88 < uVar26) {
        return uVar26;
      }
      *local_1f8 = local_1e8;
      local_1f8[1] = local_210;
      local_1f8[2] = local_128;
      dst = (void *)((long)local_1e0 + uVar26);
      local_1d0 = local_130;
      goto LAB_00181178;
    }
    if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) goto LAB_00182439;
    pZVar22 = (ZSTD_seqSymbol *)((long)ZVar21 - 0x20);
    if (oend_00 <= pZVar22) goto LAB_0018241a;
    if ((ulong)local_1d0 < (ulong)ZVar21) {
LAB_0018128f:
      pZVar30 = local_e8 + uVar13 * 3;
      pZVar19 = local_f8 + uVar13 * 3 + 1;
      sequence_00.matchLength._0_2_ = pZVar19->nextState;
      sequence_00.matchLength._2_1_ = pZVar19->nbAdditionalBits;
      sequence_00.matchLength._3_1_ = pZVar19->nbBits;
      sequence_00.matchLength._4_4_ = pZVar19->baseValue;
      sequence_00.litLength._0_2_ = pZVar27->nextState;
      sequence_00.litLength._2_1_ = pZVar27->nbAdditionalBits;
      sequence_00.litLength._3_1_ = pZVar27->nbBits;
      sequence_00.litLength._4_4_ = pZVar27->baseValue;
      sequence_00.offset._0_2_ = pZVar30->nextState;
      sequence_00.offset._2_1_ = pZVar30->nbAdditionalBits;
      sequence_00.offset._3_1_ = pZVar30->nbBits;
      sequence_00.offset._4_4_ = pZVar30->baseValue;
      uVar26 = ZSTD_execSequenceEndSplitLitBuffer
                         ((BYTE *)dst,(BYTE *)oend_00,(BYTE *)pZVar22,sequence_00,
                          (BYTE **)&local_208,(BYTE *)local_1d0,(BYTE *)local_200,local_1d8,
                          local_1f0);
      goto LAB_0018101d;
    }
    ZVar28 = local_f8[uVar13 * 3 + 1];
    uVar26 = (long)ZVar29 + (long)ZVar28;
    pZVar30 = (ZSTD_seqSymbol *)((long)dst + uVar26);
    if (pZVar22 < pZVar30) goto LAB_0018128f;
    if ((long)ZVar29 < 0) goto LAB_00182496;
    if ((long)uVar26 <= (long)ZVar29) goto LAB_00182458;
    if (oend_00 < pZVar30) goto LAB_001824b5;
    pZVar27 = (ZSTD_seqSymbol *)((long)dst + (long)ZVar29);
    if (pZVar22 < pZVar27) goto LAB_00182477;
    ZVar5 = local_e8[uVar13 * 3];
    uVar6 = *(undefined8 *)((long)local_208 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_208;
    *(undefined8 *)((long)dst + 8) = uVar6;
    if (0x10 < (ulong)ZVar29) {
      ZSTD_decompressSequencesLong_cold_2();
    }
    pZVar22 = local_200;
    pZVar19 = (ZSTD_seqSymbol *)((long)pZVar27 - (long)ZVar5);
    local_208 = ZVar21;
    if ((ulong)((long)pZVar27 - (long)local_200) < (ulong)ZVar5) {
      if ((ulong)((long)pZVar27 - (long)local_1d8) < (ulong)ZVar5) {
        return 0xffffffffffffffec;
      }
      lVar12 = ((long)pZVar27 - (long)ZVar5) - (long)local_200;
      pBVar20 = local_1f0 + lVar12;
      if (pBVar20 + (long)ZVar28 <= local_1f0) {
        memmove(pZVar27,pBVar20,(size_t)ZVar28);
        goto LAB_0018101d;
      }
      local_1f8 = pZVar30;
      memmove(pZVar27,pBVar20,-lVar12);
      pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
      ZVar28 = (ZSTD_seqSymbol)((long)ZVar28 + lVar12);
      pZVar19 = pZVar22;
      pZVar30 = local_1f8;
    }
    if (pZVar30 < pZVar27) goto LAB_001824d4;
    if (pZVar19 < pZVar22) goto LAB_001824f3;
    if (ZVar28 == (ZSTD_seqSymbol)0x0) goto LAB_00182512;
    if ((ulong)ZVar5 < 0x10) {
      if (pZVar27 < pZVar19) goto LAB_00182550;
      if ((ulong)ZVar5 < 8) {
        iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)ZVar5 * 4);
        *(BYTE *)&pZVar27->nextState = (BYTE)pZVar19->nextState;
        *(BYTE *)((long)&pZVar27->nextState + 1) = *(BYTE *)((long)&pZVar19->nextState + 1);
        pZVar27->nbAdditionalBits = pZVar19->nbAdditionalBits;
        pZVar27->nbBits = pZVar19->nbBits;
        pUVar7 = &pZVar19->nextState;
        pZVar19 = (ZSTD_seqSymbol *)
                  ((long)pZVar19 +
                  ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4) - (long)iVar10))
        ;
        pZVar27->baseValue =
             *(U32 *)((long)pUVar7 +
                     (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4));
      }
      else {
        *pZVar27 = *pZVar19;
      }
      pZVar22 = pZVar19 + 1;
      pZVar18 = pZVar27 + 1;
      if ((long)pZVar18 - (long)pZVar22 < 8) goto LAB_00182531;
      if (8 < (ulong)ZVar28) {
        if (pZVar18 < pZVar30) {
          pZVar30 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + (long)ZVar28);
          if ((ulong)((long)pZVar18 - (long)pZVar22) < 0x10) {
            do {
              *pZVar18 = *pZVar22;
              pZVar18 = pZVar18 + 1;
              pZVar22 = pZVar22 + 1;
            } while (pZVar18 < pZVar30);
          }
          else {
            ZVar21 = pZVar19[2];
            *pZVar18 = *pZVar22;
            pZVar27[2] = ZVar21;
            if (0x18 < (long)ZVar28) {
              lVar12 = 0;
              do {
                pBVar1 = (BYTE *)((long)&pZVar19[3].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar1 + 8);
                pBVar20 = (BYTE *)((long)&pZVar27[3].nextState + lVar12);
                *(undefined8 *)pBVar20 = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar20 + 8) = uVar6;
                pBVar1 = (BYTE *)((long)&pZVar19[5].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar20 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while ((ZSTD_seqSymbol *)(pBVar20 + 0x20) < pZVar30);
            }
          }
          goto LAB_0018101d;
        }
        goto LAB_0018258e;
      }
    }
    else {
      if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)pZVar27 + (-0x10 - (long)pZVar19)))
      goto LAB_001822c5;
      ZVar21 = pZVar19[1];
      *pZVar27 = *pZVar19;
      pZVar27[1] = ZVar21;
      if (0x10 < (long)ZVar28) {
        lVar12 = 0x10;
        do {
          pBVar20 = (BYTE *)((long)&pZVar19->nextState + lVar12);
          uVar6 = *(undefined8 *)(pBVar20 + 8);
          pBVar1 = (BYTE *)((long)&pZVar27->nextState + lVar12);
          *(undefined8 *)pBVar1 = *(undefined8 *)pBVar20;
          *(undefined8 *)(pBVar1 + 8) = uVar6;
          pBVar20 = (BYTE *)((long)&pZVar19[2].nextState + lVar12);
          uVar6 = *(undefined8 *)(pBVar20 + 8);
          *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)pBVar20;
          *(undefined8 *)(pBVar1 + 0x18) = uVar6;
          lVar12 = lVar12 + 0x20;
        } while (pBVar1 + 0x20 < (BYTE *)((long)&pZVar27->nextState + (long)ZVar28));
      }
    }
  }
  else {
    if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) goto LAB_001822e4;
    uVar13 = (ulong)(uVar24 & 7);
    ZVar29 = local_f8[uVar13 * 3];
    ZVar21 = (ZSTD_seqSymbol)((long)local_208 + (long)ZVar29);
    if ((ulong)ZVar21 <= (ulong)local_1d0) {
      ZVar28 = local_f8[uVar13 * 3 + 1];
      uVar26 = (long)ZVar29 + (long)ZVar28;
      pZVar27 = (ZSTD_seqSymbol *)((long)dst + uVar26);
      if (pZVar27 <= local_1c8) {
        if ((long)ZVar29 < 0) goto LAB_00182322;
        if ((long)uVar26 <= (long)ZVar29) goto LAB_00182341;
        if (oend_00 < pZVar27) goto LAB_00182303;
        pZVar22 = (ZSTD_seqSymbol *)((long)dst + (long)ZVar29);
        if (local_1c8 < pZVar22) goto LAB_00182360;
        ZVar5 = local_e8[uVar13 * 3];
        uVar6 = *(undefined8 *)((long)local_208 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_208;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < (ulong)ZVar29) {
          ZSTD_decompressSequencesLong_cold_1();
        }
        pZVar30 = (ZSTD_seqSymbol *)((long)pZVar22 - (long)ZVar5);
        local_208 = ZVar21;
        if ((ulong)((long)pZVar22 - (long)local_200) < (ulong)ZVar5) {
          if ((ulong)((long)pZVar22 - (long)local_1d8) < (ulong)ZVar5) {
            return 0xffffffffffffffec;
          }
          lVar12 = ((long)pZVar22 - (long)ZVar5) - (long)local_200;
          pBVar20 = local_1f0 + lVar12;
          if (pBVar20 + (long)ZVar28 <= local_1f0) {
            memmove(pZVar22,pBVar20,(size_t)ZVar28);
            goto LAB_0018101d;
          }
          memmove(pZVar22,pBVar20,-lVar12);
          pZVar22 = (ZSTD_seqSymbol *)((long)pZVar22 - lVar12);
          ZVar28 = (ZSTD_seqSymbol)((long)ZVar28 + lVar12);
          pZVar30 = local_200;
        }
        if (pZVar27 < pZVar22) goto LAB_0018239e;
        if (pZVar30 < local_200) goto LAB_0018237f;
        if (ZVar28 == (ZSTD_seqSymbol)0x0) goto LAB_001823bd;
        if ((ulong)ZVar5 < 0x10) {
          if (pZVar22 < pZVar30) goto LAB_00182550;
          if ((ulong)ZVar5 < 8) {
            iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)ZVar5 * 4);
            *(BYTE *)&pZVar22->nextState = (BYTE)pZVar30->nextState;
            *(BYTE *)((long)&pZVar22->nextState + 1) = *(BYTE *)((long)&pZVar30->nextState + 1);
            pZVar22->nbAdditionalBits = pZVar30->nbAdditionalBits;
            pZVar22->nbBits = pZVar30->nbBits;
            pUVar7 = &pZVar30->nextState;
            pZVar30 = (ZSTD_seqSymbol *)
                      ((long)pZVar30 +
                      ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4) -
                      (long)iVar10));
            pZVar22->baseValue =
                 *(U32 *)((long)pUVar7 +
                         (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4));
          }
          else {
            *pZVar22 = *pZVar30;
          }
          pZVar19 = pZVar30 + 1;
          pZVar18 = pZVar22 + 1;
          if ((long)pZVar18 - (long)pZVar19 < 8) goto LAB_00182531;
          if ((ulong)ZVar28 < 9) goto LAB_0018101d;
          if (pZVar27 <= pZVar18) goto LAB_0018256f;
          pZVar27 = (ZSTD_seqSymbol *)((long)&pZVar22->nextState + (long)ZVar28);
          if ((ulong)((long)pZVar18 - (long)pZVar19) < 0x10) {
            do {
              *pZVar18 = *pZVar19;
              pZVar18 = pZVar18 + 1;
              pZVar19 = pZVar19 + 1;
            } while (pZVar18 < pZVar27);
          }
          else {
            ZVar21 = pZVar30[2];
            *pZVar18 = *pZVar19;
            pZVar22[2] = ZVar21;
            if (0x18 < (long)ZVar28) {
              lVar12 = 0;
              do {
                pBVar1 = (BYTE *)((long)&pZVar30[3].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar1 + 8);
                pBVar20 = (BYTE *)((long)&pZVar22[3].nextState + lVar12);
                *(undefined8 *)pBVar20 = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar20 + 8) = uVar6;
                pBVar1 = (BYTE *)((long)&pZVar30[5].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar20 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while ((ZSTD_seqSymbol *)(pBVar20 + 0x20) < pZVar27);
            }
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)pZVar22 + (-0x10 - (long)pZVar30)))
          goto LAB_001822c5;
          ZVar21 = pZVar30[1];
          *pZVar22 = *pZVar30;
          pZVar22[1] = ZVar21;
          if (0x10 < (long)ZVar28) {
            lVar12 = 0x10;
            do {
              pBVar20 = (BYTE *)((long)&pZVar30->nextState + lVar12);
              uVar6 = *(undefined8 *)(pBVar20 + 8);
              pBVar1 = (BYTE *)((long)&pZVar22->nextState + lVar12);
              *(undefined8 *)pBVar1 = *(undefined8 *)pBVar20;
              *(undefined8 *)(pBVar1 + 8) = uVar6;
              pBVar20 = (BYTE *)((long)&pZVar30[2].nextState + lVar12);
              uVar6 = *(undefined8 *)(pBVar20 + 8);
              *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)pBVar20;
              *(undefined8 *)(pBVar1 + 0x18) = uVar6;
              lVar12 = lVar12 + 0x20;
            } while (pBVar1 + 0x20 < (BYTE *)((long)&pZVar22->nextState + (long)ZVar28));
          }
        }
        goto LAB_0018101d;
      }
    }
    pZVar30 = local_f8 + uVar13 * 3;
    pZVar27 = local_e8 + uVar13 * 3;
    pZVar22 = local_f8 + uVar13 * 3 + 1;
    sequence.matchLength._0_2_ = pZVar22->nextState;
    sequence.matchLength._2_1_ = pZVar22->nbAdditionalBits;
    sequence.matchLength._3_1_ = pZVar22->nbBits;
    sequence.matchLength._4_4_ = pZVar22->baseValue;
    sequence.litLength._0_2_ = pZVar30->nextState;
    sequence.litLength._2_1_ = pZVar30->nbAdditionalBits;
    sequence.litLength._3_1_ = pZVar30->nbBits;
    sequence.litLength._4_4_ = pZVar30->baseValue;
    sequence.offset._0_2_ = pZVar27->nextState;
    sequence.offset._2_1_ = pZVar27->nbAdditionalBits;
    sequence.offset._3_1_ = pZVar27->nbBits;
    sequence.offset._4_4_ = pZVar27->baseValue;
    uVar26 = ZSTD_execSequenceEnd
                       ((BYTE *)dst,(BYTE *)oend_00,sequence,(BYTE **)&local_208,(BYTE *)local_1d0,
                        (BYTE *)local_200,local_1d8,local_1f0);
  }
LAB_0018101d:
  if (0xffffffffffffff88 < uVar26) {
    return uVar26;
  }
  uVar13 = (ulong)(uVar24 & 7);
  local_f8[uVar13 * 3] = local_1e8;
  local_f8[uVar13 * 3 + 1] = local_210;
  local_e8[uVar13 * 3] = local_128;
  dst = (void *)((long)local_1e0 + uVar26);
LAB_00181178:
  uVar26 = (ulong)(uVar24 + 1);
  uVar13 = (ulong)local_1b0.bitsConsumed;
  goto LAB_0018085a;
LAB_00181723:
  if ((int)uVar24 < nbSeq) {
    return 0xffffffffffffffec;
  }
LAB_00181734:
  uVar24 = uVar24 - local_1bc;
  if (nbSeq <= (int)uVar24) {
LAB_00182227:
    lVar12 = 0;
    do {
      (dctx->entropy).rep[lVar12] = *(U32 *)(local_158 + lVar12);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    ZVar8 = dctx->litBufferLocation;
    ZVar21 = local_1d0;
LAB_001801bf:
    ZVar29 = local_208;
    if (ZVar8 == ZSTD_split) {
      sVar17 = (long)ZVar21 - (long)local_208;
      if ((ulong)((long)oend_00 - (long)dst) < sVar17) {
        return 0xffffffffffffffba;
      }
      if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) {
        dst._0_2_ = 0;
        dst._2_1_ = '\0';
        dst._3_1_ = '\0';
        dst._4_4_ = 0;
      }
      else {
        memmove(dst,(void *)local_208,sVar17);
        dst = (void *)((long)dst + sVar17);
      }
      ZVar29 = (ZSTD_seqSymbol)dctx->litExtraBuffer;
      ZVar21 = (ZSTD_seqSymbol)((long)dctx->litExtraBuffer + 0x10000);
    }
    sVar17 = (long)ZVar21 - (long)ZVar29;
    if (sVar17 <= (ulong)((long)oend_00 - (long)dst)) {
      if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) {
        pBVar20 = (BYTE *)0x0;
      }
      else {
        memmove(dst,(void *)ZVar29,sVar17);
        pBVar20 = (BYTE *)((long)dst + sVar17);
      }
      return (long)pBVar20 - (long)local_140;
    }
    return 0xffffffffffffffba;
  }
  local_1e8 = (ZSTD_seqSymbol)((long)dctx->litExtraBuffer + 0x10000);
LAB_0018175c:
  uVar13 = (ulong)(uVar24 & 7);
  pZVar27 = local_f8 + uVar13 * 3;
  if (dctx->litBufferLocation == ZSTD_split) {
    ZVar29 = *pZVar27;
    ZVar21 = (ZSTD_seqSymbol)((long)local_208 + (long)ZVar29);
    if (dctx->litBufferEnd < (ulong)ZVar21) {
      uVar26 = (long)dctx->litBufferEnd - (long)local_208;
      if (uVar26 != 0) {
        if ((ulong)((long)oend_00 - (long)dst) < uVar26) {
          return 0xffffffffffffffba;
        }
        ZSTD_safecopyDstBeforeSrc((BYTE *)dst,(BYTE *)local_208,uVar26);
        ZVar29 = (ZSTD_seqSymbol)((long)ZVar29 - uVar26);
        *pZVar27 = ZVar29;
        dst = (void *)((long)dst + uVar26);
      }
      local_208 = local_1b8;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) goto LAB_001822e4;
      if ((long)ZVar29 < 0x10001) {
        ZVar21 = local_f8[uVar13 * 3 + 1];
        uVar26 = (long)ZVar29 + (long)ZVar21;
        pZVar22 = (ZSTD_seqSymbol *)((long)dst + uVar26);
        if (local_1c8 < pZVar22) goto LAB_00181dd1;
        if ((long)ZVar29 < 0) goto LAB_00182322;
        if ((long)uVar26 <= (long)ZVar29) goto LAB_00182341;
        if (oend_00 < pZVar22) goto LAB_00182303;
        pZVar27 = (ZSTD_seqSymbol *)((long)dst + (long)ZVar29);
        if (local_1c8 < pZVar27) goto LAB_00182360;
        ZVar28 = local_e8[uVar13 * 3];
        uVar6 = *(undefined8 *)((long)local_1b8 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_1b8;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < (ulong)ZVar29) {
          if (0xffffffffffffffe0 < (ulong)((long)dst + 0x10 + (-0x10 - (long)local_138))) {
LAB_001822c5:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar6 = *(undefined8 *)(local_138 + 8);
          *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_138;
          *(undefined8 *)((long)dst + 0x18) = uVar6;
          if (0x10 < (long)ZVar29 - 0x10U) {
            lVar12 = 0;
            do {
              uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20 + 8);
              puVar2 = (undefined8 *)((long)dst + 0x20 + lVar12);
              *puVar2 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x20);
              puVar2[1] = uVar6;
              uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30 + 8);
              puVar2[2] = *(undefined8 *)(dctx->litExtraBuffer + lVar12 + 0x30);
              puVar2[3] = uVar6;
              lVar12 = lVar12 + 0x20;
            } while ((ZSTD_seqSymbol *)(puVar2 + 4) < pZVar27);
          }
        }
        local_208 = (ZSTD_seqSymbol)((long)ZVar29 + (long)local_1b8);
        pZVar30 = (ZSTD_seqSymbol *)((long)pZVar27 - (long)ZVar28);
        if ((ulong)((long)pZVar27 - (long)local_200) < (ulong)ZVar28) {
          if ((ulong)((long)pZVar27 - (long)local_1d8) < (ulong)ZVar28) {
            return 0xffffffffffffffec;
          }
          lVar12 = ((long)pZVar27 - (long)ZVar28) - (long)local_200;
          pBVar20 = local_1f0 + lVar12;
          if (local_1f0 < pBVar20 + (long)ZVar21) {
            memmove(pZVar27,pBVar20,-lVar12);
            pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
            ZVar21 = (ZSTD_seqSymbol)((long)ZVar21 + lVar12);
            pZVar30 = local_200;
            goto LAB_001818d9;
          }
          memmove(pZVar27,pBVar20,(size_t)ZVar21);
        }
        else {
LAB_001818d9:
          if (pZVar22 < pZVar27) goto LAB_0018239e;
          if (pZVar30 < local_200) goto LAB_0018237f;
          if (ZVar21 == (ZSTD_seqSymbol)0x0) goto LAB_001823bd;
          if ((ulong)ZVar28 < 0x10) {
            if (pZVar27 < pZVar30) goto LAB_00182550;
            if ((ulong)ZVar28 < 8) {
              iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)ZVar28 * 4);
              *(BYTE *)&pZVar27->nextState = (BYTE)pZVar30->nextState;
              *(BYTE *)((long)&pZVar27->nextState + 1) = *(BYTE *)((long)&pZVar30->nextState + 1);
              pZVar27->nbAdditionalBits = pZVar30->nbAdditionalBits;
              pZVar27->nbBits = pZVar30->nbBits;
              pUVar7 = &pZVar30->nextState;
              pZVar30 = (ZSTD_seqSymbol *)
                        ((long)pZVar30 +
                        ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar28 * 4) -
                        (long)iVar10));
              pZVar27->baseValue =
                   *(U32 *)((long)pUVar7 +
                           (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar28 * 4));
            }
            else {
              *pZVar27 = *pZVar30;
            }
            pZVar19 = pZVar30 + 1;
            pZVar18 = pZVar27 + 1;
            if ((long)pZVar18 - (long)pZVar19 < 8) goto LAB_00182531;
            if (8 < (ulong)ZVar21) {
              if (pZVar22 <= pZVar18) goto LAB_0018256f;
              pZVar22 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + (long)ZVar21);
              if ((ulong)((long)pZVar18 - (long)pZVar19) < 0x10) {
                do {
                  *pZVar18 = *pZVar19;
                  pZVar18 = pZVar18 + 1;
                  pZVar19 = pZVar19 + 1;
                } while (pZVar18 < pZVar22);
              }
              else {
                ZVar29 = pZVar30[2];
                *pZVar18 = *pZVar19;
                pZVar27[2] = ZVar29;
                if (0x18 < (long)ZVar21) {
                  lVar12 = 0;
                  do {
                    pBVar1 = (BYTE *)((long)&pZVar30[3].nextState + lVar12);
                    uVar6 = *(undefined8 *)(pBVar1 + 8);
                    pBVar20 = (BYTE *)((long)&pZVar27[3].nextState + lVar12);
                    *(undefined8 *)pBVar20 = *(undefined8 *)pBVar1;
                    *(undefined8 *)(pBVar20 + 8) = uVar6;
                    pBVar1 = (BYTE *)((long)&pZVar30[5].nextState + lVar12);
                    uVar6 = *(undefined8 *)(pBVar1 + 8);
                    *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pBVar1;
                    *(undefined8 *)(pBVar20 + 0x18) = uVar6;
                    lVar12 = lVar12 + 0x20;
                  } while ((ZSTD_seqSymbol *)(pBVar20 + 0x20) < pZVar22);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)pZVar27 + (-0x10 - (long)pZVar30)))
            goto LAB_001822c5;
            ZVar29 = pZVar30[1];
            *pZVar27 = *pZVar30;
            pZVar27[1] = ZVar29;
            if (0x10 < (long)ZVar21) {
              lVar12 = 0x10;
              do {
                pBVar20 = (BYTE *)((long)&pZVar30->nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar20 + 8);
                pBVar1 = (BYTE *)((long)&pZVar27->nextState + lVar12);
                *(undefined8 *)pBVar1 = *(undefined8 *)pBVar20;
                *(undefined8 *)(pBVar1 + 8) = uVar6;
                pBVar20 = (BYTE *)((long)&pZVar30[2].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar20 + 8);
                *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)pBVar20;
                *(undefined8 *)(pBVar1 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while (pBVar1 + 0x20 < (BYTE *)((long)&pZVar27->nextState + (long)ZVar21));
            }
          }
        }
      }
      else {
LAB_00181dd1:
        pZVar22 = local_e8 + uVar13 * 3;
        pZVar30 = local_f8 + uVar13 * 3 + 1;
        sequence_04.matchLength._0_2_ = pZVar30->nextState;
        sequence_04.matchLength._2_1_ = pZVar30->nbAdditionalBits;
        sequence_04.matchLength._3_1_ = pZVar30->nbBits;
        sequence_04.matchLength._4_4_ = pZVar30->baseValue;
        sequence_04.litLength._0_2_ = pZVar27->nextState;
        sequence_04.litLength._2_1_ = pZVar27->nbAdditionalBits;
        sequence_04.litLength._3_1_ = pZVar27->nbBits;
        sequence_04.litLength._4_4_ = pZVar27->baseValue;
        sequence_04.offset._0_2_ = pZVar22->nextState;
        sequence_04.offset._2_1_ = pZVar22->nbAdditionalBits;
        sequence_04.offset._3_1_ = pZVar22->nbBits;
        sequence_04.offset._4_4_ = pZVar22->baseValue;
        uVar26 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,(BYTE *)oend_00,sequence_04,(BYTE **)&local_208,
                            (BYTE *)local_1e8,(BYTE *)local_200,local_1d8,local_1f0);
      }
      if (0xffffffffffffff88 < uVar26) {
        return uVar26;
      }
      dst = (void *)((long)dst + uVar26);
      local_1d0 = local_1e8;
      goto LAB_00181cf3;
    }
    if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) {
LAB_00182439:
      __assert_fail("op != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8b1,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pZVar22 = (ZSTD_seqSymbol *)((long)ZVar21 - 0x20);
    if (oend_00 <= pZVar22) {
LAB_0018241a:
      __assert_fail("oend_w < oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8b2,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if ((ulong)local_1d0 < (ulong)ZVar21) {
LAB_00181d4f:
      pZVar30 = local_e8 + uVar13 * 3;
      pZVar19 = local_f8 + uVar13 * 3 + 1;
      sequence_03.matchLength._0_2_ = pZVar19->nextState;
      sequence_03.matchLength._2_1_ = pZVar19->nbAdditionalBits;
      sequence_03.matchLength._3_1_ = pZVar19->nbBits;
      sequence_03.matchLength._4_4_ = pZVar19->baseValue;
      sequence_03.litLength._0_2_ = pZVar27->nextState;
      sequence_03.litLength._2_1_ = pZVar27->nbAdditionalBits;
      sequence_03.litLength._3_1_ = pZVar27->nbBits;
      sequence_03.litLength._4_4_ = pZVar27->baseValue;
      sequence_03.offset._0_2_ = pZVar30->nextState;
      sequence_03.offset._2_1_ = pZVar30->nbAdditionalBits;
      sequence_03.offset._3_1_ = pZVar30->nbBits;
      sequence_03.offset._4_4_ = pZVar30->baseValue;
      local_1e0 = (ZSTD_seqSymbol)dst;
      uVar26 = ZSTD_execSequenceEndSplitLitBuffer
                         ((BYTE *)dst,(BYTE *)oend_00,(BYTE *)pZVar22,sequence_03,
                          (BYTE **)&local_208,(BYTE *)local_1d0,(BYTE *)local_200,local_1d8,
                          local_1f0);
      goto LAB_00181c9d;
    }
    ZVar28 = local_f8[uVar13 * 3 + 1];
    uVar26 = (long)ZVar28 + (long)ZVar29;
    pZVar30 = (ZSTD_seqSymbol *)((long)dst + uVar26);
    if (pZVar22 < pZVar30) goto LAB_00181d4f;
    local_1e0 = (ZSTD_seqSymbol)dst;
    if ((long)ZVar29 < 0) {
LAB_00182496:
      __assert_fail("op <= oLitEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8bf,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if ((long)uVar26 <= (long)ZVar29) {
LAB_00182458:
      __assert_fail("oLitEnd < oMatchEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8c0,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (oend_00 < pZVar30) {
LAB_001824b5:
      __assert_fail("oMatchEnd <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8c1,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pZVar27 = (ZSTD_seqSymbol *)((long)dst + (long)ZVar29);
    if (pZVar22 < pZVar27) {
LAB_00182477:
      __assert_fail("oLitEnd <= oend_w",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8c3,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    ZVar5 = local_e8[uVar13 * 3];
    uVar6 = *(undefined8 *)((long)local_208 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_208;
    *(undefined8 *)((long)dst + 8) = uVar6;
    if (0x10 < (ulong)ZVar29) {
      ZSTD_decompressSequencesLong_cold_4();
    }
    pZVar22 = (ZSTD_seqSymbol *)((long)pZVar27 - (long)ZVar5);
    local_208 = ZVar21;
    if ((ulong)((long)pZVar27 - (long)local_200) < (ulong)ZVar5) {
      if ((ulong)((long)pZVar27 - (long)local_1d8) < (ulong)ZVar5) {
        return 0xffffffffffffffec;
      }
      lVar12 = (long)pZVar22 - (long)local_200;
      pBVar20 = local_1f0 + lVar12;
      if (pBVar20 + (long)ZVar28 <= local_1f0) {
        memmove(pZVar27,pBVar20,(size_t)ZVar28);
        goto LAB_00181c9d;
      }
      memmove(pZVar27,pBVar20,-lVar12);
      pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
      ZVar28 = (ZSTD_seqSymbol)((long)ZVar28 + lVar12);
      pZVar22 = local_200;
    }
    if (pZVar30 < pZVar27) {
LAB_001824d4:
      __assert_fail("op <= oMatchEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8e3,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (pZVar22 < local_200) {
LAB_001824f3:
      __assert_fail("match >= prefixStart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8e5,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (ZVar28 == (ZSTD_seqSymbol)0x0) {
LAB_00182512:
      __assert_fail("sequence.matchLength >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa8e6,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (0xf < (ulong)ZVar5) {
      if ((BYTE *)((long)pZVar27 + (-0x10 - (long)pZVar22)) < (BYTE *)0xffffffffffffffe1) {
        ZVar21 = pZVar22[1];
        *pZVar27 = *pZVar22;
        pZVar27[1] = ZVar21;
        if (0x10 < (long)ZVar28) {
          lVar12 = 0x10;
          do {
            pBVar20 = (BYTE *)((long)&pZVar22->nextState + lVar12);
            uVar6 = *(undefined8 *)(pBVar20 + 8);
            pBVar1 = (BYTE *)((long)&pZVar27->nextState + lVar12);
            *(undefined8 *)pBVar1 = *(undefined8 *)pBVar20;
            *(undefined8 *)(pBVar1 + 8) = uVar6;
            pBVar20 = (BYTE *)((long)&pZVar22[2].nextState + lVar12);
            uVar6 = *(undefined8 *)(pBVar20 + 8);
            *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)pBVar20;
            *(undefined8 *)(pBVar1 + 0x18) = uVar6;
            lVar12 = lVar12 + 0x20;
          } while (pBVar1 + 0x20 < (BYTE *)((long)&pZVar27->nextState + (long)ZVar28));
        }
        goto LAB_00181c9d;
      }
      goto LAB_001822c5;
    }
    if (pZVar27 < pZVar22) {
LAB_00182550:
      __assert_fail("*ip <= *op",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
    }
    if ((ulong)ZVar5 < 8) {
      iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)ZVar5 * 4);
      *(BYTE *)&pZVar27->nextState = (BYTE)pZVar22->nextState;
      *(BYTE *)((long)&pZVar27->nextState + 1) = *(BYTE *)((long)&pZVar22->nextState + 1);
      pZVar27->nbAdditionalBits = pZVar22->nbAdditionalBits;
      pZVar27->nbBits = pZVar22->nbBits;
      pUVar7 = &pZVar22->nextState;
      pZVar22 = (ZSTD_seqSymbol *)
                ((long)pZVar22 +
                ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4) - (long)iVar10));
      pZVar27->baseValue =
           *(U32 *)((long)pUVar7 + (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4))
      ;
    }
    else {
      *pZVar27 = *pZVar22;
    }
    pZVar19 = pZVar22 + 1;
    pZVar18 = pZVar27 + 1;
    if ((long)pZVar18 - (long)pZVar19 < 8) {
LAB_00182531:
      __assert_fail("*op - *ip >= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
    }
    if (8 < (ulong)ZVar28) {
      if (pZVar30 <= pZVar18) {
LAB_0018258e:
        __assert_fail("op < oMatchEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa8fa,
                      "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      pZVar30 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + (long)ZVar28);
      if ((ulong)((long)pZVar18 - (long)pZVar19) < 0x10) {
        do {
          *pZVar18 = *pZVar19;
          pZVar18 = pZVar18 + 1;
          pZVar19 = pZVar19 + 1;
        } while (pZVar18 < pZVar30);
      }
      else {
        ZVar21 = pZVar22[2];
        *pZVar18 = *pZVar19;
        pZVar27[2] = ZVar21;
        if (0x18 < (long)ZVar28) {
          lVar12 = 0;
          do {
            pBVar1 = (BYTE *)((long)&pZVar22[3].nextState + lVar12);
            uVar6 = *(undefined8 *)(pBVar1 + 8);
            pBVar20 = (BYTE *)((long)&pZVar27[3].nextState + lVar12);
            *(undefined8 *)pBVar20 = *(undefined8 *)pBVar1;
            *(undefined8 *)(pBVar20 + 8) = uVar6;
            pBVar1 = (BYTE *)((long)&pZVar22[5].nextState + lVar12);
            uVar6 = *(undefined8 *)(pBVar1 + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pBVar1;
            *(undefined8 *)(pBVar20 + 0x18) = uVar6;
            lVar12 = lVar12 + 0x20;
          } while ((ZSTD_seqSymbol *)(pBVar20 + 0x20) < pZVar30);
        }
      }
    }
  }
  else {
    if ((ZSTD_seqSymbol)dst == (ZSTD_seqSymbol)0x0) {
LAB_001822e4:
      __assert_fail("op != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa850,
                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    ZVar29 = *pZVar27;
    ZVar21 = (ZSTD_seqSymbol)((long)local_208 + (long)ZVar29);
    if ((ulong)ZVar21 <= (ulong)local_1d0) {
      ZVar28 = local_f8[uVar13 * 3 + 1];
      uVar26 = (long)ZVar29 + (long)ZVar28;
      pZVar22 = (ZSTD_seqSymbol *)((long)dst + uVar26);
      if (pZVar22 <= local_1c8) {
        local_1e0 = (ZSTD_seqSymbol)dst;
        if ((long)ZVar29 < 0) {
LAB_00182322:
          __assert_fail("op <= oLitEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa863,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((long)uVar26 <= (long)ZVar29) {
LAB_00182341:
          __assert_fail("oLitEnd < oMatchEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa864,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (oend_00 < pZVar22) {
LAB_00182303:
          __assert_fail("oMatchEnd <= oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa865,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        pZVar27 = (ZSTD_seqSymbol *)((long)dst + (long)ZVar29);
        if (local_1c8 < pZVar27) {
LAB_00182360:
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa867,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        ZVar5 = local_e8[uVar13 * 3];
        uVar6 = *(undefined8 *)((long)local_208 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_208;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < (ulong)ZVar29) {
          ZSTD_decompressSequencesLong_cold_3();
        }
        pZVar30 = local_200;
        pZVar19 = (ZSTD_seqSymbol *)((long)pZVar27 - (long)ZVar5);
        local_208 = ZVar21;
        if ((ulong)((long)pZVar27 - (long)local_200) < (ulong)ZVar5) {
          if ((ulong)((long)pZVar27 - (long)local_1d8) < (ulong)ZVar5) {
            return 0xffffffffffffffec;
          }
          lVar12 = ((long)pZVar27 - (long)ZVar5) - (long)local_200;
          pBVar20 = local_1f0 + lVar12;
          if (pBVar20 + (long)ZVar28 <= local_1f0) {
            memmove(pZVar27,pBVar20,(size_t)ZVar28);
            goto LAB_00181c9d;
          }
          memmove(pZVar27,pBVar20,-lVar12);
          pZVar27 = (ZSTD_seqSymbol *)((long)pZVar27 - lVar12);
          ZVar28 = (ZSTD_seqSymbol)((long)ZVar28 + lVar12);
          pZVar19 = pZVar30;
        }
        if (pZVar22 < pZVar27) {
LAB_0018239e:
          __assert_fail("op <= oMatchEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa888,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (pZVar19 < pZVar30) {
LAB_0018237f:
          __assert_fail("match >= prefixStart",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa88a,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (ZVar28 == (ZSTD_seqSymbol)0x0) {
LAB_001823bd:
          __assert_fail("sequence.matchLength >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa88b,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((ulong)ZVar5 < 0x10) {
          if (pZVar27 < pZVar19) goto LAB_00182550;
          if ((ulong)ZVar5 < 8) {
            iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)ZVar5 * 4);
            *(BYTE *)&pZVar27->nextState = (BYTE)pZVar19->nextState;
            *(BYTE *)((long)&pZVar27->nextState + 1) = *(BYTE *)((long)&pZVar19->nextState + 1);
            pZVar27->nbAdditionalBits = pZVar19->nbAdditionalBits;
            pZVar27->nbBits = pZVar19->nbBits;
            pUVar7 = &pZVar19->nextState;
            pZVar19 = (ZSTD_seqSymbol *)
                      ((long)pZVar19 +
                      ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4) -
                      (long)iVar10));
            pZVar27->baseValue =
                 *(U32 *)((long)pUVar7 +
                         (ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + (long)ZVar5 * 4));
          }
          else {
            *pZVar27 = *pZVar19;
          }
          pZVar30 = pZVar19 + 1;
          pZVar18 = pZVar27 + 1;
          if ((long)pZVar18 - (long)pZVar30 < 8) goto LAB_00182531;
          if ((ulong)ZVar28 < 9) goto LAB_00181c9d;
          if (pZVar22 <= pZVar18) {
LAB_0018256f:
            __assert_fail("op < oMatchEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa89f,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          pZVar22 = (ZSTD_seqSymbol *)((long)&pZVar27->nextState + (long)ZVar28);
          if ((ulong)((long)pZVar18 - (long)pZVar30) < 0x10) {
            do {
              *pZVar18 = *pZVar30;
              pZVar18 = pZVar18 + 1;
              pZVar30 = pZVar30 + 1;
            } while (pZVar18 < pZVar22);
          }
          else {
            ZVar21 = pZVar19[2];
            *pZVar18 = *pZVar30;
            pZVar27[2] = ZVar21;
            if (0x18 < (long)ZVar28) {
              lVar12 = 0;
              do {
                pBVar1 = (BYTE *)((long)&pZVar19[3].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar1 + 8);
                pBVar20 = (BYTE *)((long)&pZVar27[3].nextState + lVar12);
                *(undefined8 *)pBVar20 = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar20 + 8) = uVar6;
                pBVar1 = (BYTE *)((long)&pZVar19[5].nextState + lVar12);
                uVar6 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar20 + 0x18) = uVar6;
                lVar12 = lVar12 + 0x20;
              } while ((ZSTD_seqSymbol *)(pBVar20 + 0x20) < pZVar22);
            }
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)pZVar27 + (-0x10 - (long)pZVar19)))
          goto LAB_001822c5;
          ZVar21 = pZVar19[1];
          *pZVar27 = *pZVar19;
          pZVar27[1] = ZVar21;
          if (0x10 < (long)ZVar28) {
            lVar12 = 0x10;
            do {
              pBVar20 = (BYTE *)((long)&pZVar19->nextState + lVar12);
              uVar6 = *(undefined8 *)(pBVar20 + 8);
              pBVar1 = (BYTE *)((long)&pZVar27->nextState + lVar12);
              *(undefined8 *)pBVar1 = *(undefined8 *)pBVar20;
              *(undefined8 *)(pBVar1 + 8) = uVar6;
              pBVar20 = (BYTE *)((long)&pZVar19[2].nextState + lVar12);
              uVar6 = *(undefined8 *)(pBVar20 + 8);
              *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)pBVar20;
              *(undefined8 *)(pBVar1 + 0x18) = uVar6;
              lVar12 = lVar12 + 0x20;
            } while (pBVar1 + 0x20 < (BYTE *)((long)&pZVar27->nextState + (long)ZVar28));
          }
        }
        goto LAB_00181c9d;
      }
    }
    pZVar22 = local_e8 + uVar13 * 3;
    pZVar30 = local_f8 + uVar13 * 3 + 1;
    sequence_02.matchLength._0_2_ = pZVar30->nextState;
    sequence_02.matchLength._2_1_ = pZVar30->nbAdditionalBits;
    sequence_02.matchLength._3_1_ = pZVar30->nbBits;
    sequence_02.matchLength._4_4_ = pZVar30->baseValue;
    sequence_02.litLength._0_2_ = pZVar27->nextState;
    sequence_02.litLength._2_1_ = pZVar27->nbAdditionalBits;
    sequence_02.litLength._3_1_ = pZVar27->nbBits;
    sequence_02.litLength._4_4_ = pZVar27->baseValue;
    sequence_02.offset._0_2_ = pZVar22->nextState;
    sequence_02.offset._2_1_ = pZVar22->nbAdditionalBits;
    sequence_02.offset._3_1_ = pZVar22->nbBits;
    sequence_02.offset._4_4_ = pZVar22->baseValue;
    local_1e0 = (ZSTD_seqSymbol)dst;
    uVar26 = ZSTD_execSequenceEnd
                       ((BYTE *)dst,(BYTE *)oend_00,sequence_02,(BYTE **)&local_208,
                        (BYTE *)local_1d0,(BYTE *)local_200,local_1d8,local_1f0);
  }
LAB_00181c9d:
  if (0xffffffffffffff88 < uVar26) {
    return uVar26;
  }
  dst = (void *)((long)local_1e0 + uVar26);
LAB_00181cf3:
  uVar24 = uVar24 + 1;
  if (uVar24 == nbSeq) goto LAB_00182227;
  goto LAB_0018175c;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset,
                             const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}